

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O2

void __thiscall
TEST_CommandLineArguments_setStrictNameFilterSameParameter_Test::testBody
          (TEST_CommandLineArguments_setStrictNameFilterSameParameter_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  TestFilter *pTVar4;
  TestFilter *filter;
  char *pcVar5;
  char *pcVar6;
  undefined1 auStack_78 [16];
  undefined1 local_68 [16];
  TestFilter nameFilter;
  char *argv [2];
  
  argv[0] = "tests.exe";
  argv[1] = "-snname";
  pUVar2 = UtestShell::getCurrent();
  bVar1 = TEST_GROUP_CppUTestGroupCommandLineArguments::newArgumentParser
                    (&this->super_TEST_GROUP_CppUTestGroupCommandLineArguments,2,argv);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","newArgumentParser(argc, argv)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
             ,0x17d,pTVar3);
  TestFilter::TestFilter(&nameFilter,"name");
  TestFilter::strictMatching(&nameFilter);
  pTVar4 = CommandLineArguments::getNameFilters
                     ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
  bVar1 = TestFilter::operator!=(&nameFilter,pTVar4);
  if (bVar1) {
    pTVar4 = CommandLineArguments::getNameFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    filter = CommandLineArguments::getNameFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    bVar1 = TestFilter::operator!=(pTVar4,filter);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0x180);
    }
    bVar1 = TestFilter::operator!=(&nameFilter,&nameFilter);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0x180);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom((TestFilter *)local_68);
    pcVar5 = SimpleString::asCharString((SimpleString *)local_68);
    CommandLineArguments::getNameFilters
              ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    StringFrom((TestFilter *)auStack_78);
    pcVar6 = SimpleString::asCharString((SimpleString *)auStack_78);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0x180,pTVar3);
    SimpleString::~SimpleString((SimpleString *)auStack_78);
    SimpleString::~SimpleString((SimpleString *)local_68);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0x180,pTVar3);
  }
  SimpleString::~SimpleString(&nameFilter.filter_);
  return;
}

Assistant:

TEST(CommandLineArguments, setStrictNameFilterSameParameter)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "-snname" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter nameFilter("name");
    nameFilter.strictMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters());
}